

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcards.cpp
# Opt level: O0

int Wildcard::asterisk(char **wildcard,char **test)

{
  int iVar1;
  long *in_RSI;
  long *in_RDI;
  bool bVar2;
  int fit;
  int local_1c;
  int local_4;
  
  local_1c = 1;
  *in_RDI = *in_RDI + 1;
  while( true ) {
    bVar2 = false;
    if ((*(char *)*in_RSI != '\0') && (bVar2 = true, *(char *)*in_RDI != '?')) {
      bVar2 = *(char *)*in_RDI == '*';
    }
    if (!bVar2) break;
    if (*(char *)*in_RDI == '?') {
      *in_RSI = *in_RSI + 1;
    }
    *in_RDI = *in_RDI + 1;
  }
  while (*(char *)*in_RDI == '*') {
    *in_RDI = *in_RDI + 1;
  }
  if ((*(char *)*in_RSI == '\0') && (*(char *)*in_RDI != '\0')) {
    local_4 = 0;
  }
  else if ((*(char *)*in_RSI == '\0') && (*(char *)*in_RDI == '\0')) {
    local_4 = 1;
  }
  else {
    iVar1 = wildcardfit((char *)in_RDI,(char *)in_RSI);
    if (iVar1 == 0) {
      do {
        *in_RSI = *in_RSI + 1;
        while( true ) {
          bVar2 = false;
          if ((*(char *)*in_RDI != *(char *)*in_RSI) && (bVar2 = false, *(char *)*in_RDI != '[')) {
            bVar2 = *(char *)*in_RSI != '\0';
          }
          if (!bVar2) break;
          *in_RSI = *in_RSI + 1;
        }
        if (*(char *)*in_RSI == '\0') {
          local_1c = 0;
          bVar2 = false;
        }
        else {
          iVar1 = wildcardfit((char *)in_RDI,(char *)in_RSI);
          bVar2 = iVar1 == 0;
        }
      } while (bVar2);
    }
    if ((*(char *)*in_RSI == '\0') && (*(char *)*in_RDI == '\0')) {
      local_1c = 1;
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

int Wildcard::asterisk(const char** wildcard, const char** test) {
  /* Warning: uses multiple returns */
  int fit = 1;

  /* erase the leading asterisk */
  (*wildcard)++;
  while (('\000' != (**test)) && (('?' == **wildcard) || ('*' == **wildcard))) {
    if ('?' == **wildcard) (*test)++;
    (*wildcard)++;
  }
  /* Now it could be that test is empty and wildcard contains */
  /* aterisks. Then we delete them to get a proper state */
  while ('*' == (**wildcard))
    (*wildcard)++;

  if (('\0' == (**test)) && ('\0' != (**wildcard))) return (fit = 0);
  if (('\0' == (**test)) && ('\0' == (**wildcard)))
    return (fit = 1);
  else {
    /* Neither test nor wildcard are empty!          */
    /* the first character of wildcard isn't in [*?] */
    if (0 == wildcardfit(*wildcard, (*test))) {
      do {
        (*test)++;
        /* skip as much characters as possible in the teststring */
        /* stop if a character match occurs */
        while (((**wildcard) != (**test)) && ('[' != (**wildcard)) &&
               ('\0' != (**test)))
          (*test)++;
      } while ((('\0' != **test)) ? (0 == wildcardfit(*wildcard, (*test))) :
                                    (0 != (fit = 0)));
    }
    if (('\0' == **test) && ('\0' == **wildcard)) fit = 1;
    return (fit);
  }
}